

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  ulong uVar1;
  byte *pbVar2;
  uchar uVar3;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  size_t deflatesize;
  uchar *deflatedata;
  size_t local_70;
  uchar *local_68;
  ucvector local_60;
  uint local_44;
  uchar **local_40;
  ulong *local_38;
  
  local_68 = (uchar *)0x0;
  local_70 = 0;
  uVar6 = 0xffffffffffffffff;
  uVar8 = *outsize;
  puVar5 = *out;
  uVar14 = uVar8 + 1;
  puVar4 = puVar5;
  uVar1 = uVar8;
  local_40 = out;
  local_38 = outsize;
  if (uVar14 == 0) {
LAB_0053134b:
    local_60.allocsize = uVar1;
    puVar4[uVar8] = 'x';
    puVar5 = puVar4;
    uVar15 = uVar8 + 2;
    uVar8 = uVar6;
    local_60.data = puVar4;
    local_60.size = uVar14;
  }
  else {
    uVar6 = uVar14 * 3 >> 1;
    if (uVar8 * 2 < uVar14) {
      uVar6 = uVar14;
    }
    local_60.data = puVar5;
    local_60.size = uVar8;
    local_60.allocsize = uVar8;
    puVar4 = (uchar *)realloc(puVar5,uVar6);
    uVar15 = uVar14;
    uVar1 = uVar6;
    if (puVar4 != (uchar *)0x0) goto LAB_0053134b;
  }
  puVar4 = local_60.data;
  uVar6 = local_60.allocsize;
  if (uVar8 < uVar15) {
    uVar6 = uVar15 * 3 >> 1;
    if (uVar8 * 2 < uVar15) {
      uVar6 = uVar15;
    }
    puVar5 = (uchar *)realloc(puVar5,uVar6);
    puVar4 = puVar5;
    if (puVar5 == (uchar *)0x0) goto LAB_005313a5;
  }
  local_60.allocsize = uVar6;
  local_60.data = puVar4;
  puVar5[uVar15 - 1] = '\x01';
  local_60.size = uVar15;
LAB_005313a5:
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    local_44 = lodepng_deflate(&local_68,&local_70,in,insize,settings);
  }
  else {
    local_44 = (*settings->custom_deflate)(&local_68,&local_70,in,insize,settings);
  }
  if (local_44 == 0) {
    if ((int)insize == 0) {
      uVar12 = 1;
    }
    else {
      uVar12 = 1;
      uVar13 = 0;
      do {
        uVar16 = (uint)insize;
        uVar9 = 0x15ae;
        if (uVar16 < 0x15ae) {
          uVar9 = uVar16;
        }
        uVar10 = uVar16;
        if (0x15ad < (insize & 0xffffffff)) {
          uVar10 = 0x15ae;
        }
        lVar11 = 0;
        do {
          pbVar2 = in + lVar11;
          lVar11 = lVar11 + 1;
          uVar12 = uVar12 + *pbVar2;
          uVar13 = uVar13 + uVar12;
        } while (uVar10 != (uint)lVar11);
        in = in + uVar9;
        uVar12 = uVar12 % 0xfff1;
        uVar13 = uVar13 % 0xfff1;
        insize = (size_t)(uVar16 - uVar9);
      } while (uVar16 - uVar9 != 0);
      uVar12 = uVar13 << 0x10 | uVar12;
    }
    uVar8 = local_60.size;
    puVar5 = local_60.data;
    uVar6 = local_60.allocsize;
    if (local_70 != 0) {
      sVar7 = 0;
      do {
        uVar1 = uVar8 + 1;
        uVar3 = local_68[sVar7];
        puVar4 = puVar5;
        uVar14 = uVar6;
        if (uVar6 < uVar1) {
          uVar14 = uVar1 * 3 >> 1;
          if (uVar6 * 2 < uVar1) {
            uVar14 = uVar1;
          }
          puVar4 = (uchar *)realloc(puVar5,uVar14);
          if (puVar4 != (uchar *)0x0) goto LAB_005314d7;
        }
        else {
LAB_005314d7:
          puVar4[uVar8] = uVar3;
          uVar8 = uVar1;
          puVar5 = puVar4;
          uVar6 = uVar14;
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != local_70);
    }
    local_60.data = puVar5;
    local_60.size = uVar8;
    local_60.allocsize = uVar6;
    free(local_68);
    lodepng_add32bitInt(&local_60,uVar12);
  }
  *local_40 = local_60.data;
  *local_38 = local_60.size;
  return local_44;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings)
{
  /*initially, *out must be NULL and outsize 0, if you just give some random *out
  that's pointing to a non allocated buffer, this'll crash*/
  ucvector outv;
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
  unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
  unsigned FLEVEL = 0;
  unsigned FDICT = 0;
  unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
  unsigned FCHECK = 31 - CMFFLG % 31;
  CMFFLG += FCHECK;

  /*ucvector-controlled version of the output buffer, for dynamic array*/
  ucvector_init_buffer(&outv, *out, *outsize);

  ucvector_push_back(&outv, (unsigned char)(CMFFLG >> 8));
  ucvector_push_back(&outv, (unsigned char)(CMFFLG & 255));

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  if(!error)
  {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    for(i = 0; i != deflatesize; ++i) ucvector_push_back(&outv, deflatedata[i]);
    lodepng_free(deflatedata);
    lodepng_add32bitInt(&outv, ADLER32);
  }

  *out = outv.data;
  *outsize = outv.size;

  return error;
}